

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_runtime_api.cc
# Opt level: O2

int TVMStreamStreamSynchronize
              (int device_type,int device_id,TVMStreamHandle src,TVMStreamHandle dst)

{
  DeviceAPI *pDVar1;
  TVMContext ctx;
  
  ctx.device_id = device_id;
  ctx.device_type = device_type;
  pDVar1 = tvm::runtime::DeviceAPIManager::Get(&ctx);
  (*pDVar1->_vptr_DeviceAPI[0xb])(pDVar1,ctx,src,dst);
  return 0;
}

Assistant:

int TVMStreamStreamSynchronize(int device_type,
                               int device_id,
                               TVMStreamHandle src,
                               TVMStreamHandle dst) {
  API_BEGIN();
  TVMContext ctx;
  ctx.device_type = static_cast<DLDeviceType>(device_type);
  ctx.device_id = device_id;
  DeviceAPIManager::Get(ctx)->SyncStreamFromTo(ctx, src, dst);
  API_END();
}